

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode https_connecting(connectdata *conn,_Bool *done)

{
  CURLcode CVar1;
  
  CVar1 = Curl_ssl_connect_nonblocking(conn,0,done);
  if (CVar1 != CURLE_OK) {
    Curl_conncontrol(conn,1);
  }
  return CVar1;
}

Assistant:

static CURLcode https_connecting(struct connectdata *conn, bool *done)
{
  CURLcode result;
  DEBUGASSERT((conn) && (conn->handler->flags & PROTOPT_SSL));

  /* perform SSL initialization for this socket */
  result = Curl_ssl_connect_nonblocking(conn, FIRSTSOCKET, done);
  if(result)
    connclose(conn, "Failed HTTPS connection");

  return result;
}